

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin.c
# Opt level: O0

int coda_bin_close(coda_product *product)

{
  int iVar1;
  coda_bin_product *product_file;
  coda_product *product_local;
  
  iVar1 = coda_bin_product_close((coda_bin_product *)product);
  if (iVar1 == 0) {
    if (product->filename != (char *)0x0) {
      free(product->filename);
    }
    free(product);
    product_local._4_4_ = 0;
  }
  else {
    product_local._4_4_ = -1;
  }
  return product_local._4_4_;
}

Assistant:

int coda_bin_close(coda_product *product)
{
    coda_bin_product *product_file = (coda_bin_product *)product;

    if (coda_bin_product_close(product_file) != 0)
    {
        return -1;
    }

    if (product_file->filename != NULL)
    {
        free(product_file->filename);
    }

    free(product_file);

    return 0;
}